

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O1

uint8_t read_cfl_alphas(FRAME_CONTEXT *ec_ctx,aom_reader *r,int8_t *signs_out)

{
  od_ec_dec *dec;
  aom_cdf_prob *paVar1;
  ushort uVar2;
  ushort uVar3;
  short sVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  byte bVar8;
  uint uVar9;
  aom_cdf_prob (*icdf) [17];
  uint8_t uVar10;
  long lVar11;
  int iVar12;
  
  paVar1 = ec_ctx->cfl_sign_cdf;
  dec = &r->ec;
  iVar6 = od_ec_decode_cdf_q15(dec,paVar1,8);
  cVar5 = (char)iVar6;
  if (r->allow_update_cdf != '\0') {
    uVar2 = ec_ctx->cfl_sign_cdf[8];
    bVar8 = (char)(uVar2 >> 4) + 5;
    lVar11 = 0;
    do {
      uVar3 = paVar1[lVar11];
      if (lVar11 < cVar5) {
        sVar4 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar8 & 0x1f));
      }
      else {
        sVar4 = -(uVar3 >> (bVar8 & 0x1f));
      }
      paVar1[lVar11] = sVar4 + uVar3;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 7);
    ec_ctx->cfl_sign_cdf[8] = ec_ctx->cfl_sign_cdf[8] + (ushort)(uVar2 < 0x20);
  }
  iVar6 = (int)cVar5;
  uVar9 = iVar6 + (iVar6 + 1) * 10 + 1;
  iVar12 = (int)uVar9 >> 5;
  if (uVar9 < 0x20) {
    uVar10 = '\0';
  }
  else {
    paVar1 = ec_ctx->cfl_sign_cdf + (long)iVar6 * 0x11 + -0x19;
    iVar7 = od_ec_decode_cdf_q15(dec,paVar1,0x10);
    if (r->allow_update_cdf != '\0') {
      uVar2 = paVar1[0x10];
      bVar8 = (char)(uVar2 >> 4) + 5;
      lVar11 = 0;
      do {
        uVar3 = paVar1[lVar11];
        if (lVar11 < (char)iVar7) {
          sVar4 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar8 & 0x1f));
        }
        else {
          sVar4 = -(uVar3 >> (bVar8 & 0x1f));
        }
        paVar1[lVar11] = sVar4 + uVar3;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0xf);
      paVar1[0x10] = paVar1[0x10] + (ushort)(uVar2 < 0x20);
    }
    uVar10 = (char)iVar7 << 4;
  }
  iVar6 = iVar6 + 1 + iVar12 * -3;
  if (iVar6 != 0) {
    iVar6 = iVar6 * 3 + iVar12 + -3;
    icdf = ec_ctx->cfl_alpha_cdf + iVar6;
    iVar12 = od_ec_decode_cdf_q15(dec,*icdf,0x10);
    if (r->allow_update_cdf != '\0') {
      uVar2 = ec_ctx->cfl_alpha_cdf[iVar6][0x10];
      bVar8 = (char)(uVar2 >> 4) + 5;
      lVar11 = 0;
      do {
        uVar3 = (*icdf)[lVar11];
        if (lVar11 < (char)iVar12) {
          sVar4 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar8 & 0x1f));
        }
        else {
          sVar4 = -(uVar3 >> (bVar8 & 0x1f));
        }
        (*icdf)[lVar11] = sVar4 + uVar3;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0xf);
      paVar1 = ec_ctx->cfl_alpha_cdf[iVar6] + 0x10;
      *paVar1 = *paVar1 + (ushort)(uVar2 < 0x20);
    }
    uVar10 = uVar10 + (char)iVar12;
  }
  *signs_out = cVar5;
  return uVar10;
}

Assistant:

static uint8_t read_cfl_alphas(FRAME_CONTEXT *const ec_ctx, aom_reader *r,
                               int8_t *signs_out) {
  const int8_t joint_sign =
      aom_read_symbol(r, ec_ctx->cfl_sign_cdf, CFL_JOINT_SIGNS, "cfl:signs");
  uint8_t idx = 0;
  // Magnitudes are only coded for nonzero values
  if (CFL_SIGN_U(joint_sign) != CFL_SIGN_ZERO) {
    aom_cdf_prob *cdf_u = ec_ctx->cfl_alpha_cdf[CFL_CONTEXT_U(joint_sign)];
    idx = (uint8_t)aom_read_symbol(r, cdf_u, CFL_ALPHABET_SIZE, "cfl:alpha_u")
          << CFL_ALPHABET_SIZE_LOG2;
  }
  if (CFL_SIGN_V(joint_sign) != CFL_SIGN_ZERO) {
    aom_cdf_prob *cdf_v = ec_ctx->cfl_alpha_cdf[CFL_CONTEXT_V(joint_sign)];
    idx += (uint8_t)aom_read_symbol(r, cdf_v, CFL_ALPHABET_SIZE, "cfl:alpha_v");
  }
  *signs_out = joint_sign;
  return idx;
}